

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::Delete_Aux(BpTree<int> *this,IndexNode<int> *C,int k,Addr p)

{
  pointer piVar1;
  pointer pcVar2;
  pointer pAVar3;
  Addr *pAVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  IndexNode<int> *pIVar15;
  IndexNode<int> *C_00;
  bool bVar16;
  uint local_764;
  uint local_760;
  IndexNode<int> D;
  IndexNode<int> P;
  IndexNode<int> local_690;
  IndexNode<int> local_630;
  IndexNode<int> local_5d0;
  IndexNode<int> local_570;
  IndexNode<int> local_510;
  IndexNode<int> local_4b0;
  IndexNode<int> local_450;
  IndexNode<int> local_3f0;
  IndexNode<int> local_390;
  IndexNode<int> local_330;
  IndexNode<int> local_2d0;
  IndexNode<int> local_270;
  IndexNode<int> local_210;
  IndexNode<int> local_1b0;
  IndexNode<int> local_150;
  IndexNode<int> local_f0;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_1b0,C);
  Buffer::Lock(&blocks,local_1b0.self.BlockNum);
  IndexNode<int>::~IndexNode(&local_1b0);
  IndexNode<int>::IndexNode(&D,this->N);
  iVar8 = this->N;
  iVar9 = 1;
  if (1 < iVar8) {
    iVar9 = iVar8;
  }
  for (uVar14 = 0;
      (uVar13 = (ulong)(iVar9 - 1), iVar9 - 1 != uVar14 &&
      (uVar13 = uVar14,
      (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar14] != k)); uVar14 = uVar14 + 1) {
  }
  while (uVar14 = uVar13 + 1, (long)uVar14 < (long)(iVar8 + -1)) {
    piVar1 = (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar1[uVar13] = piVar1[uVar14];
    pcVar2 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pcVar2[uVar13] = pcVar2[uVar14];
    uVar13 = uVar14;
    iVar8 = this->N;
  }
  (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [(long)iVar8 + -2] = '0';
  IndexNode<int>::IndexNode(&local_90,C);
  IndexNode<int>::~IndexNode(&local_90);
  uVar7 = this->N;
  pAVar3 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_90.NodeState == '1') {
    uVar12 = 1;
    if (1 < (int)uVar7) {
      uVar12 = uVar7;
    }
    for (uVar14 = 0;
        (uVar13 = (ulong)(uVar12 - 1), uVar12 - 1 != uVar14 &&
        (uVar13 = uVar14, pAVar3[uVar14].FileOff != p.FileOff)); uVar14 = uVar14 + 1) {
    }
    while( true ) {
      uVar14 = uVar13 + 1;
      pAVar3 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(int)(uVar7 - 1) <= (long)uVar14) break;
      pAVar3[uVar13] = pAVar3[uVar14];
      uVar7 = this->N;
      uVar13 = uVar14;
    }
    pAVar3 = pAVar3 + (long)(int)uVar7 + -2;
  }
  else {
    uVar13 = 0;
    uVar14 = 0;
    if (0 < (int)uVar7) {
      uVar14 = (ulong)uVar7;
    }
    for (; (uVar11 = uVar14, uVar14 != uVar13 &&
           (uVar11 = uVar13, pAVar3[uVar13].FileOff != p.FileOff)); uVar13 = uVar13 + 1) {
    }
    while( true ) {
      uVar14 = uVar11 + 1;
      pAVar3 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(int)uVar7 <= (long)uVar14) break;
      pAVar3[uVar11] = pAVar3[uVar14];
      uVar7 = this->N;
      uVar11 = uVar14;
    }
    pAVar3 = pAVar3 + (long)(int)uVar7 + -1;
  }
  ((Addr *)(&pAVar3->FileOff + -1))->BlockNum = -1;
  pAVar3->FileOff = -1;
  IndexNode<int>::IndexNode(&local_f0,C);
  IndexNode<int>::~IndexNode(&local_f0);
  if (local_f0.parent.FileOff == -1) {
    IndexNode<int>::IndexNode(&local_150,C);
    IndexNode<int>::~IndexNode(&local_150);
    if (local_150.NodeState == '1') {
      if (*(C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start == '0') {
LAB_00131333:
        this->RootAddr =
             *(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
              ._M_start;
        DeleteNode(this,C);
        goto LAB_001315a8;
      }
      IndexNode<int>::IndexNode(&local_210,C);
      UpdateBlock(this,&local_210);
      pIVar15 = &local_210;
    }
    else {
      pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pAVar4[1].FileOff == -1) {
        FindNode(this,*pAVar4,&D);
        D.parent = C->parent;
        IndexNode<int>::IndexNode(&local_270,&D);
        UpdateBlock(this,&local_270);
        IndexNode<int>::~IndexNode(&local_270);
        goto LAB_00131333;
      }
      IndexNode<int>::IndexNode(&local_2d0,C);
      UpdateBlock(this,&local_2d0);
      pIVar15 = &local_2d0;
    }
  }
  else {
    IndexNode<int>::IndexNode(&local_330,C);
    iVar8 = IsFew(this,&local_330);
    IndexNode<int>::~IndexNode(&local_330);
    if (iVar8 == 0) {
      IndexNode<int>::IndexNode(&local_390,C);
      UpdateBlock(this,&local_390);
      pIVar15 = &local_390;
      goto LAB_001315a3;
    }
    IndexNode<int>::IndexNode(&P,this->N);
    FindNode(this,C->parent,&P);
    uVar7 = this->N;
    uVar13 = 0;
    uVar14 = 0;
    if (0 < (int)uVar7) {
      uVar14 = (ulong)uVar7;
    }
    for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
      if (P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13].FileOff == (C->self).FileOff) {
        uVar14 = uVar13 & 0xffffffff;
        break;
      }
    }
    iVar8 = (int)uVar14;
    uVar12 = iVar8 + 1;
    bVar5 = false;
    local_760 = 0xffffffff;
    if ((int)uVar12 < (int)uVar7) {
      if (P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12].FileOff == -1) {
        local_764 = 0xffffffff;
      }
      else {
        FindNode(this,P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12],&D);
        if (iVar8 == 0) {
          IndexNode<int>::IndexNode(&local_630,C);
          IndexNode<int>::IndexNode(&local_690,&D);
          iVar9 = CanFit(this,&local_630,&local_690);
          if (iVar9 == 0) goto LAB_0013120a;
          IndexNode<int>::~IndexNode(&local_690);
          IndexNode<int>::~IndexNode(&local_630);
          goto LAB_001313d8;
        }
LAB_0013120a:
        if (((int)uVar12 < this->N) &&
           (P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar12].FileOff != -1)) {
          IndexNode<int>::IndexNode(&local_3f0,C);
          IndexNode<int>::IndexNode(&local_450,&D);
          iVar9 = CanFit(this,&local_3f0,&local_450);
          IndexNode<int>::~IndexNode(&local_450);
          IndexNode<int>::~IndexNode(&local_3f0);
          if (iVar8 == 0) {
            IndexNode<int>::~IndexNode(&local_690);
            IndexNode<int>::~IndexNode(&local_630);
            if (iVar9 != 0) goto LAB_001313d8;
            bVar5 = false;
            local_764 = 0xffffffff;
          }
          else if (iVar9 == 0) {
            bVar5 = false;
            local_764 = 0xffffffff;
          }
          else {
LAB_001313d8:
            bVar5 = true;
            local_764 = uVar12;
          }
        }
        else {
          local_764 = 0xffffffff;
          bVar5 = false;
          if (iVar8 == 0) {
            IndexNode<int>::~IndexNode(&local_690);
            IndexNode<int>::~IndexNode(&local_630);
          }
        }
      }
    }
    else {
      local_764 = 0xffffffff;
    }
    uVar7 = 1;
    if (iVar8 != 0) {
      local_760 = iVar8 - 1;
      FindNode(this,P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[local_760],&D);
      if ((uVar12 == this->N) ||
         (P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12].FileOff == -1)) {
        IndexNode<int>::IndexNode(&local_4b0,C);
        IndexNode<int>::IndexNode(&local_510,&D);
        iVar9 = CanFit(this,&local_4b0,&local_510);
        bVar16 = true;
        bVar6 = true;
        if (iVar9 == 0) goto LAB_0013146e;
LAB_001314d7:
        IndexNode<int>::~IndexNode(&local_510);
        IndexNode<int>::~IndexNode(&local_4b0);
      }
      else {
        bVar6 = false;
LAB_0013146e:
        IndexNode<int>::IndexNode(&local_570,C);
        IndexNode<int>::IndexNode(&local_5d0,&D);
        iVar9 = CanFit(this,&local_570,&local_5d0);
        bVar16 = iVar9 != 0;
        IndexNode<int>::~IndexNode(&local_5d0);
        IndexNode<int>::~IndexNode(&local_570);
        if (bVar6) goto LAB_001314d7;
      }
      uVar7 = local_760;
      if (bVar16) {
        local_764 = local_760;
        bVar5 = true;
      }
    }
    uVar10 = local_764;
    if (!bVar5) {
      uVar10 = uVar7;
    }
    FindNode(this,P.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar10],&D);
    if ((int)uVar10 <= iVar8) {
      uVar14 = (long)(int)uVar10;
    }
    if (bVar5) {
      C_00 = &D;
      pIVar15 = C;
      if (local_764 != uVar12) {
        if (local_764 != local_760) goto LAB_0013159e;
        pIVar15 = &D;
        C_00 = C;
      }
      Coalesce(this,C_00,pIVar15,
               P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar14]);
    }
    else {
      Redistribute(this,C,&D,
                   P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start[uVar14],iVar8,uVar7);
    }
LAB_0013159e:
    pIVar15 = &P;
  }
LAB_001315a3:
  IndexNode<int>::~IndexNode(pIVar15);
LAB_001315a8:
  IndexNode<int>::~IndexNode(&D);
  return;
}

Assistant:

void BpTree<K>::Delete_Aux(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	IndexNode<K> D(N);
	int pos, i, j, m, n, flag = 0;
	for (i = 0; i < N - 1 && C.k[i] != k; i++);
	for (j = i + 1; j < N - 1; j++) {
		C.k[j - 1] = C.k[j];
		C.v[j - 1] = C.v[j];
	}
	C.v[N - 2] = '0';										//ɾ��k
	if (this->IsLeaf(C)) {
		for (i = 0; i < N - 1 && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N - 1; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 2] = { -1, -1 };
	}
	else {
		for (i = 0; i < N && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 1] = { -1, -1 };
	}														//ɾ��p
	if (this->IsRoot(C)) {
		if (this->IsLeaf(C)) {								//������ֻʣһ�����
			if (C.v[0] == '0') {							//��û�м�ֵ
				this->RootAddr = C.p[0];					//�����
				this->DeleteNode(C);
			}
			else {
				//���м�ֵ������
				this->UpdateBlock(C);
			}
		}
		else {												//�����к���
			if (C.p[1].FileOff == -1) {						//��ֻ��һ������
				this->FindNode(C.p[0], D);
				D.parent = C.parent;
				this->UpdateBlock(D);
				this->RootAddr = C.p[0];
				this->DeleteNode(C);						//��ת�������ĺ���
			}
			else {
				//������и��ຢ�ӣ�����
				this->UpdateBlock(C);
			}
		}
		return;
	}
	//�Ǹ����
	if (!this->IsFew(C)) {
		this->UpdateBlock(C);
		return;
	}
	//ָ�������ֵ��̫�٣����Ǻϲ����߷�̯
	j = -1;
	IndexNode<K> P(N);
	this->FindNode(C.parent, P);
	for (i = 0; i < N && P.p[i].FileOff != C.self.FileOff; i++);	//P.p[i] == C.self
	if (i+1 < N && P.p[i + 1].FileOff != -1) {
		this->FindNode(P.p[i + 1], D);
		if ((i == 0 && CanFit(C, D) ||
			(i + 1 < N && P.p[i + 1].FileOff != -1 && CanFit(C, D)))) {
			j = i + 1;		//��������֮�ɺϲ�����D = P_i+1
			flag = 1;
		}
	}
	if (i > 0) {
		this->FindNode(P.p[i - 1], D);
		if (((i + 1 == N || P.p[i + 1].FileOff == -1) && CanFit(C, D)) ||
			(i > 0 && CanFit(C, D))) {
			j = i - 1;		//��������֮�ɺϲ�����D = P_i-1
			flag = 1;
		}
	}
	//�������ڽԿɺϲ�ʱ������ѡD = P_i-1
	if (!flag) {
		j = (i == 0) ? 1 : i - 1;
		//���Ҳ����ɺϲ����ھӣ�����ѡ���ھ�
	}
	this->FindNode(P.p[j], D);
	K k2 = (i < j) ? P.k[i] : P.k[j];
	if (flag) {
		//�ϲ�����
		if (j == i + 1) {
			this->Coalesce(D, C, k2);
		}
		else if(j == i-1) {
			this->Coalesce(C, D, k2);
		}
	}
	else {
		//��̯����
		this->Redistribute(C, D, k2, i, j);
	}
	return;
}